

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 451.test.cpp
# Opt level: O2

void verifyChunk(Type<7,_451> *chunk)

{
  int iVar1;
  range_reference_t<D<true>_>_conflict pdVar2;
  long lVar3;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  double local_100;
  AssertionHandler catchAssertionHandler;
  undefined1 local_b0 [8];
  undefined8 local_a8;
  char *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [2];
  undefined1 local_78 [8];
  bool local_70;
  bool bStack_6f;
  undefined6 uStack_6e;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_68;
  WithinRelMatcher *local_60;
  ITransientExpression local_50;
  double *local_40;
  WithinRelMatcher *local_38;
  
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x8a;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "451 == chunk.MT()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_b0,capturedExpression,
             ContinueOnFailure);
  local_a8._0_2_ = 0x101;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d02b0;
  local_a8._4_4_ = 0x1c3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  local_98[0]._8_4_ = 0x1c3;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x8b;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1c;
  capturedExpression_00.m_start = "451 == chunk.sectionNumber()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_b0,capturedExpression_00,
             ContinueOnFailure);
  local_a8._0_2_ = 0x101;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d02b0;
  local_a8._4_4_ = 0x1c3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  local_98[0]._8_4_ = 0x1c3;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x8d;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x11;
  capturedExpression_01.m_start = "122 == chunk.ZA()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_b0,capturedExpression_01,
             ContinueOnFailure);
  local_98[0]._8_4_ = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).ZA_;
  local_a8._1_1_ = local_98[0]._8_4_ == 0x7a;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d02b0;
  local_a8._4_4_ = 0x7a;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x8e;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x1f;
  capturedExpression_02.m_start = "122 == chunk.targetIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_b0,capturedExpression_02,
             ContinueOnFailure);
  local_98[0]._8_4_ = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).ZA_;
  local_a8._1_1_ = local_98[0]._8_4_ == 0x7a;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d02b0;
  local_a8._4_4_ = 0x7a;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x8f;
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  capturedExpression_03.m_size = 0x1d;
  capturedExpression_03.m_start = "15., WithinRel( chunk.AWR() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_b0,capturedExpression_03,
             ContinueOnFailure);
  local_50._vptr_ITransientExpression = (_func_int **)0x402e000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_b0,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).atomicWeightRatio_);
  bStack_6f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_b0,(double *)&local_50);
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001d02f0;
  local_68._M_current = (double *)&local_50;
  local_60 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x90;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x2b;
  capturedExpression_04.m_start = "15., WithinRel( chunk.atomicWeightRatio() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)local_b0,capturedExpression_04,
             ContinueOnFailure);
  local_50._vptr_ITransientExpression = (_func_int **)0x402e000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_b0,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).atomicWeightRatio_);
  bStack_6f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_b0,(double *)&local_50);
  local_70 = true;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_001d02f0;
  local_68._M_current = (double *)&local_50;
  local_60 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_78);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x91;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0xf;
  capturedExpression_05.m_start = "1 == chunk.NA()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_05,(SourceLineInfo *)local_b0,capturedExpression_05,
             ContinueOnFailure);
  local_98[0]._8_4_ =
       (undefined4)
       (((long)(chunk->elements_).
               super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(chunk->elements_).
              super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x48);
  local_a8._1_1_ = local_98[0]._8_4_ == 1;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0330;
  local_a8._4_4_ = 1;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x92;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x1b;
  capturedExpression_06.m_start = "1 == chunk.numberElements()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_06,(SourceLineInfo *)local_b0,capturedExpression_06,
             ContinueOnFailure);
  local_98[0]._8_4_ =
       (undefined4)
       (((long)(chunk->elements_).
               super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(chunk->elements_).
              super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x48);
  local_a8._1_1_ = local_98[0]._8_4_ == 1;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0330;
  local_a8._4_4_ = 1;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x94;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x1c;
  capturedExpression_07.m_start = "1 == chunk.elements().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_07,(SourceLineInfo *)local_b0,capturedExpression_07,
             ContinueOnFailure);
  lVar3 = (long)(chunk->elements_).
                super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->elements_).
                super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_98[0]._8_8_ = lVar3 / 0x48;
  local_a8._1_1_ = lVar3 == 0x48;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0370;
  local_a8._4_4_ = 1;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x96;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x1e;
  capturedExpression_08.m_start = "2 == chunk.elements()[0].NAS()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_08,(SourceLineInfo *)local_b0,capturedExpression_08,
             ContinueOnFailure);
  iVar1 = (int)((_Head_base<2UL,_long,_false> *)
               ((long)&(((chunk->elements_).
                         super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.
                       fields + 0x18))->_M_head_impl;
  local_a8._1_1_ = iVar1 == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d02b0;
  local_a8._4_4_ = 2;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  local_98[0]._8_4_ = iVar1;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x97;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x26;
  capturedExpression_09.m_start = "2 == chunk.elements()[0].numberAtoms()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_09,(SourceLineInfo *)local_b0,capturedExpression_09,
             ContinueOnFailure);
  local_98[0]._8_4_ =
       (undefined4)
       ((_Head_base<2UL,_long,_false> *)
       ((long)&(((chunk->elements_).
                 super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                 ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields +
       0x18))->_M_head_impl;
  local_a8._1_1_ = local_98[0]._8_4_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d02b0;
  local_a8._4_4_ = 2;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x98;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x1d;
  capturedExpression_10.m_start = "3 == chunk.elements()[0].NI()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_10,(SourceLineInfo *)local_b0,capturedExpression_10,
             ContinueOnFailure);
  local_98[0]._8_4_ =
       *(undefined4 *)
        &(((chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields;
  local_a8._1_1_ = local_98[0]._8_4_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d02b0;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x99;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x29;
  capturedExpression_11.m_start = "3 == chunk.elements()[0].numberIsotopes()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_11,(SourceLineInfo *)local_b0,capturedExpression_11,
             ContinueOnFailure);
  local_98[0]._8_4_ =
       *(undefined4 *)
        &(((chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields;
  local_a8._1_1_ = local_98[0]._8_4_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d02b0;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x9b;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x25;
  capturedExpression_12.m_start = "3 == chunk.elements()[0].ZAI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_12,(SourceLineInfo *)local_b0,capturedExpression_12,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_98[0]._8_8_ =
       (ulong)((long)local_60 +
              (CONCAT62(uStack_6e,CONCAT11(bStack_6f,local_70)) - (long)local_68._M_current >> 3) +
              -1) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0370;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x9c;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x34;
  capturedExpression_13.m_start = "3 == chunk.elements()[0].isotopeIdentifiers().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_13,(SourceLineInfo *)local_b0,capturedExpression_13,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_98[0]._8_8_ =
       (ulong)((long)local_60 +
              (CONCAT62(uStack_6e,CONCAT11(bStack_6f,local_70)) - (long)local_68._M_current >> 3) +
              -1) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0370;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x9d;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x26;
  capturedExpression_14.m_start = "3 == chunk.elements()[0].LISI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_14,(SourceLineInfo *)local_b0,capturedExpression_14,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_98[0]._8_8_ =
       (ulong)((long)local_60 +
              (CONCAT62(uStack_6e,CONCAT11(bStack_6f,local_70)) - (long)local_68._M_current >> 3) +
              -1) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0370;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x9e;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x30;
  capturedExpression_15.m_start = "3 == chunk.elements()[0].isomericStates().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_15,(SourceLineInfo *)local_b0,capturedExpression_15,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_98[0]._8_8_ =
       (ulong)((long)local_60 +
              (CONCAT62(uStack_6e,CONCAT11(bStack_6f,local_70)) - (long)local_68._M_current >> 3) +
              -1) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0370;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0x9f;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x25;
  capturedExpression_16.m_start = "3 == chunk.elements()[0].AFI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_16,(SourceLineInfo *)local_b0,capturedExpression_16,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_98[0]._8_8_ =
       (ulong)((long)local_60 +
              (CONCAT62(uStack_6e,CONCAT11(bStack_6f,local_70)) - (long)local_68._M_current >> 3) +
              -1) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0370;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xa0;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x2c;
  capturedExpression_17.m_start = "3 == chunk.elements()[0].abundances().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_17,(SourceLineInfo *)local_b0,capturedExpression_17,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_98[0]._8_8_ =
       (ulong)((long)local_60 +
              (CONCAT62(uStack_6e,CONCAT11(bStack_6f,local_70)) - (long)local_68._M_current >> 3) +
              -1) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0370;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xa1;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x26;
  capturedExpression_18.m_start = "3 == chunk.elements()[0].AWRI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_18,(SourceLineInfo *)local_b0,capturedExpression_18,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_98[0]._8_8_ =
       (ulong)((long)local_60 +
              (CONCAT62(uStack_6e,CONCAT11(bStack_6f,local_70)) - (long)local_68._M_current >> 3) +
              -1) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0370;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xa2;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x34;
  capturedExpression_19.m_start = "3 == chunk.elements()[0].atomicWeightRatios().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_19,(SourceLineInfo *)local_b0,capturedExpression_19,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_98[0]._8_8_ =
       (ulong)((long)local_60 +
              (CONCAT62(uStack_6e,CONCAT11(bStack_6f,local_70)) - (long)local_68._M_current >> 3) +
              -1) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0370;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xa3;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x25;
  capturedExpression_20.m_start = "3 == chunk.elements()[0].SFI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_20,(SourceLineInfo *)local_b0,capturedExpression_20,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_98[0]._8_8_ =
       (ulong)((long)local_60 +
              (CONCAT62(uStack_6e,CONCAT11(bStack_6f,local_70)) - (long)local_68._M_current >> 3) +
              -1) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0370;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xa4;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x3d;
  capturedExpression_21.m_start = "3 == chunk.elements()[0].freeScatteringCrossSections().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_21,(SourceLineInfo *)local_b0,capturedExpression_21,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_98[0]._8_8_ =
       (ulong)((long)local_60 +
              (CONCAT62(uStack_6e,CONCAT11(bStack_6f,local_70)) - (long)local_68._M_current >> 3) +
              -1) / (ulong)local_60;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0370;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xa5;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x24;
  capturedExpression_22.m_start = "8016 == chunk.elements()[0].ZAI()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_22,(SourceLineInfo *)local_b0,capturedExpression_22,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  local_98[0]._8_8_ = *pdVar2;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 8016.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03b0;
  local_a8._4_4_ = 0x1f50;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xa6;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x24;
  capturedExpression_23.m_start = "8017 == chunk.elements()[0].ZAI()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_23,(SourceLineInfo *)local_b0,capturedExpression_23,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  local_98[0]._8_8_ = *pdVar2;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 8017.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03b0;
  local_a8._4_4_ = 0x1f51;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xa7;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x24;
  capturedExpression_24.m_start = "8018 == chunk.elements()[0].ZAI()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_24,(SourceLineInfo *)local_b0,capturedExpression_24,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,2);
  local_98[0]._8_8_ = *pdVar2;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 8018.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03b0;
  local_a8._4_4_ = 0x1f52;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xa8;
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  capturedExpression_25.m_size = 0x33;
  capturedExpression_25.m_start = "8016 == chunk.elements()[0].isotopeIdentifiers()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_25,(SourceLineInfo *)local_b0,capturedExpression_25,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  local_98[0]._8_8_ = *pdVar2;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 8016.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03b0;
  local_a8._4_4_ = 0x1f50;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xa9;
  macroName_26.m_size = 5;
  macroName_26.m_start = "CHECK";
  capturedExpression_26.m_size = 0x33;
  capturedExpression_26.m_start = "8017 == chunk.elements()[0].isotopeIdentifiers()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_26,(SourceLineInfo *)local_b0,capturedExpression_26,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  local_98[0]._8_8_ = *pdVar2;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 8017.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03b0;
  local_a8._4_4_ = 0x1f51;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xaa;
  macroName_27.m_size = 5;
  macroName_27.m_start = "CHECK";
  capturedExpression_27.m_size = 0x33;
  capturedExpression_27.m_start = "8018 == chunk.elements()[0].isotopeIdentifiers()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_27,(SourceLineInfo *)local_b0,capturedExpression_27,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,2);
  local_98[0]._8_8_ = *pdVar2;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 8018.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03b0;
  local_a8._4_4_ = 0x1f52;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xab;
  macroName_28.m_size = 5;
  macroName_28.m_start = "CHECK";
  capturedExpression_28.m_size = 0x22;
  capturedExpression_28.m_start = "0 == chunk.elements()[0].LISI()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_28,(SourceLineInfo *)local_b0,capturedExpression_28,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  local_98[0]._8_8_ = *pdVar2;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 0.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03b0;
  local_a8 = local_a8 & 0xffffffff;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xac;
  macroName_29.m_size = 5;
  macroName_29.m_start = "CHECK";
  capturedExpression_29.m_size = 0x22;
  capturedExpression_29.m_start = "0 == chunk.elements()[0].LISI()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_29,(SourceLineInfo *)local_b0,capturedExpression_29,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  local_98[0]._8_8_ = *pdVar2;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 0.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03b0;
  local_a8 = local_a8 & 0xffffffff;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xad;
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  capturedExpression_30.m_size = 0x22;
  capturedExpression_30.m_start = "0 == chunk.elements()[0].LISI()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_30,(SourceLineInfo *)local_b0,capturedExpression_30,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,2);
  local_98[0]._8_8_ = *pdVar2;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 0.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03b0;
  local_a8 = local_a8 & 0xffffffff;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xae;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0x2c;
  capturedExpression_31.m_start = "0 == chunk.elements()[0].isomericStates()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_31,(SourceLineInfo *)local_b0,capturedExpression_31,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  local_98[0]._8_8_ = *pdVar2;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 0.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03b0;
  local_a8 = local_a8 & 0xffffffff;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xaf;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0x2c;
  capturedExpression_32.m_start = "0 == chunk.elements()[0].isomericStates()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_32,(SourceLineInfo *)local_b0,capturedExpression_32,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  local_98[0]._8_8_ = *pdVar2;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 0.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03b0;
  local_a8 = local_a8 & 0xffffffff;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xb0;
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  capturedExpression_33.m_size = 0x2c;
  capturedExpression_33.m_start = "0 == chunk.elements()[0].isomericStates()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_33,(SourceLineInfo *)local_b0,capturedExpression_33,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,2);
  local_98[0]._8_8_ = *pdVar2;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 0.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03b0;
  local_a8 = local_a8 & 0xffffffff;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xb1;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x36;
  capturedExpression_34.m_start = "9.976200e-1, WithinRel( chunk.elements()[0].AFI()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_34,(SourceLineInfo *)local_b0,capturedExpression_34,
             ContinueOnFailure);
  local_100 = 0.99762;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xb2;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x36;
  capturedExpression_35.m_start = "3.800000e-4, WithinRel( chunk.elements()[0].AFI()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_35,(SourceLineInfo *)local_b0,capturedExpression_35,
             ContinueOnFailure);
  local_100 = 0.00038;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xb3;
  macroName_36.m_size = 10;
  macroName_36.m_start = "CHECK_THAT";
  capturedExpression_36.m_size = 0x36;
  capturedExpression_36.m_start = "2.000000e-3, WithinRel( chunk.elements()[0].AFI()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_36,(SourceLineInfo *)local_b0,capturedExpression_36,
             ContinueOnFailure);
  local_100 = 0.002;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xb4;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x3d;
  capturedExpression_37.m_start = "9.976200e-1, WithinRel( chunk.elements()[0].abundances()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_37,(SourceLineInfo *)local_b0,capturedExpression_37,
             ContinueOnFailure);
  local_100 = 0.99762;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xb5;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x3d;
  capturedExpression_38.m_start = "3.800000e-4, WithinRel( chunk.elements()[0].abundances()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_38,(SourceLineInfo *)local_b0,capturedExpression_38,
             ContinueOnFailure);
  local_100 = 0.00038;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xb6;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x3d;
  capturedExpression_39.m_start = "2.000000e-3, WithinRel( chunk.elements()[0].abundances()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_39,(SourceLineInfo *)local_b0,capturedExpression_39,
             ContinueOnFailure);
  local_100 = 0.002;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xb7;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x34;
  capturedExpression_40.m_start = "15.85751, WithinRel( chunk.elements()[0].AWRI()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_40,(SourceLineInfo *)local_b0,capturedExpression_40,
             ContinueOnFailure);
  local_100 = 15.85751;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xb8;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x34;
  capturedExpression_41.m_start = "16.85310, WithinRel( chunk.elements()[0].AWRI()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_41,(SourceLineInfo *)local_b0,capturedExpression_41,
             ContinueOnFailure);
  local_100 = 16.8531;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xb9;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x34;
  capturedExpression_42.m_start = "17.84450, WithinRel( chunk.elements()[0].AWRI()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_42,(SourceLineInfo *)local_b0,capturedExpression_42,
             ContinueOnFailure);
  local_100 = 17.8445;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xba;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x42;
  capturedExpression_43.m_start =
       "15.85751, WithinRel( chunk.elements()[0].atomicWeightRatios()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_43,(SourceLineInfo *)local_b0,capturedExpression_43,
             ContinueOnFailure);
  local_100 = 15.85751;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xbb;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x42;
  capturedExpression_44.m_start =
       "16.85310, WithinRel( chunk.elements()[0].atomicWeightRatios()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_44,(SourceLineInfo *)local_b0,capturedExpression_44,
             ContinueOnFailure);
  local_100 = 16.8531;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xbc;
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  capturedExpression_45.m_size = 0x42;
  capturedExpression_45.m_start =
       "17.84450, WithinRel( chunk.elements()[0].atomicWeightRatios()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_45,(SourceLineInfo *)local_b0,capturedExpression_45,
             ContinueOnFailure);
  local_100 = 17.8445;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xbd;
  macroName_46.m_size = 10;
  macroName_46.m_start = "CHECK_THAT";
  capturedExpression_46.m_size = 0x33;
  capturedExpression_46.m_start = "3.744801, WithinRel( chunk.elements()[0].SFI()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_46,(SourceLineInfo *)local_b0,capturedExpression_46,
             ContinueOnFailure);
  local_100 = 3.744801;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xbe;
  macroName_47.m_size = 10;
  macroName_47.m_start = "CHECK_THAT";
  capturedExpression_47.m_size = 0x33;
  capturedExpression_47.m_start = "3.642671, WithinRel( chunk.elements()[0].SFI()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_47,(SourceLineInfo *)local_b0,capturedExpression_47,
             ContinueOnFailure);
  local_100 = 3.642671;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xbf;
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  capturedExpression_48.m_size = 0x33;
  capturedExpression_48.m_start = "3.846775, WithinRel( chunk.elements()[0].SFI()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_48,(SourceLineInfo *)local_b0,capturedExpression_48,
             ContinueOnFailure);
  local_100 = 3.846775;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xc0;
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  capturedExpression_49.m_size = 0x4b;
  capturedExpression_49.m_start =
       "3.744801, WithinRel( chunk.elements()[0].freeScatteringCrossSections()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_49,(SourceLineInfo *)local_b0,capturedExpression_49,
             ContinueOnFailure);
  local_100 = 3.744801;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xc1;
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  capturedExpression_50.m_size = 0x4b;
  capturedExpression_50.m_start =
       "3.642671, WithinRel( chunk.elements()[0].freeScatteringCrossSections()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_50,(SourceLineInfo *)local_b0,capturedExpression_50,
             ContinueOnFailure);
  local_100 = 3.642671;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xc2;
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  capturedExpression_51.m_size = 0x4b;
  capturedExpression_51.m_start =
       "3.846775, WithinRel( chunk.elements()[0].freeScatteringCrossSections()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_51,(SourceLineInfo *)local_b0,capturedExpression_51,
             ContinueOnFailure);
  local_100 = 3.846775;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_78,
             (chunk->elements_).
             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pdVar2 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_78,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar2);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02f0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x182488;
  local_a8 = (pointer)0xc4;
  macroName_52.m_size = 5;
  macroName_52.m_start = "CHECK";
  capturedExpression_52.m_size = 0xf;
  capturedExpression_52.m_start = "5 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_52,(SourceLineInfo *)local_b0,capturedExpression_52,
             ContinueOnFailure);
  local_98[0]._8_8_ = njoy::ENDFtk::section::Type<7,_451>::NC(chunk);
  local_a8._1_1_ = local_98[0]._8_8_ == 5;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03f0;
  local_a8._4_4_ = 5;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunk( const section::Type< 7, 451 >& chunk ) {

  CHECK( 451 == chunk.MT() );
  CHECK( 451 == chunk.sectionNumber() );

  CHECK( 122 == chunk.ZA() );
  CHECK( 122 == chunk.targetIdentifier() );
  CHECK_THAT( 15., WithinRel( chunk.AWR() ) );
  CHECK_THAT( 15., WithinRel( chunk.atomicWeightRatio() ) );
  CHECK( 1 == chunk.NA() );
  CHECK( 1 == chunk.numberElements() );

  CHECK( 1 == chunk.elements().size() );

  CHECK( 2 == chunk.elements()[0].NAS() );
  CHECK( 2 == chunk.elements()[0].numberAtoms() );
  CHECK( 3 == chunk.elements()[0].NI() );
  CHECK( 3 == chunk.elements()[0].numberIsotopes() );

  CHECK( 3 == chunk.elements()[0].ZAI().size() );
  CHECK( 3 == chunk.elements()[0].isotopeIdentifiers().size() );
  CHECK( 3 == chunk.elements()[0].LISI().size() );
  CHECK( 3 == chunk.elements()[0].isomericStates().size() );
  CHECK( 3 == chunk.elements()[0].AFI().size() );
  CHECK( 3 == chunk.elements()[0].abundances().size() );
  CHECK( 3 == chunk.elements()[0].AWRI().size() );
  CHECK( 3 == chunk.elements()[0].atomicWeightRatios().size() );
  CHECK( 3 == chunk.elements()[0].SFI().size() );
  CHECK( 3 == chunk.elements()[0].freeScatteringCrossSections().size() );
  CHECK( 8016 == chunk.elements()[0].ZAI()[0] );
  CHECK( 8017 == chunk.elements()[0].ZAI()[1] );
  CHECK( 8018 == chunk.elements()[0].ZAI()[2] );
  CHECK( 8016 == chunk.elements()[0].isotopeIdentifiers()[0] );
  CHECK( 8017 == chunk.elements()[0].isotopeIdentifiers()[1] );
  CHECK( 8018 == chunk.elements()[0].isotopeIdentifiers()[2] );
  CHECK( 0 == chunk.elements()[0].LISI()[0] );
  CHECK( 0 == chunk.elements()[0].LISI()[1] );
  CHECK( 0 == chunk.elements()[0].LISI()[2] );
  CHECK( 0 == chunk.elements()[0].isomericStates()[0] );
  CHECK( 0 == chunk.elements()[0].isomericStates()[1] );
  CHECK( 0 == chunk.elements()[0].isomericStates()[2] );
  CHECK_THAT( 9.976200e-1, WithinRel( chunk.elements()[0].AFI()[0] ) );
  CHECK_THAT( 3.800000e-4, WithinRel( chunk.elements()[0].AFI()[1] ) );
  CHECK_THAT( 2.000000e-3, WithinRel( chunk.elements()[0].AFI()[2] ) );
  CHECK_THAT( 9.976200e-1, WithinRel( chunk.elements()[0].abundances()[0] ) );
  CHECK_THAT( 3.800000e-4, WithinRel( chunk.elements()[0].abundances()[1] ) );
  CHECK_THAT( 2.000000e-3, WithinRel( chunk.elements()[0].abundances()[2] ) );
  CHECK_THAT(    15.85751, WithinRel( chunk.elements()[0].AWRI()[0] ) );
  CHECK_THAT(    16.85310, WithinRel( chunk.elements()[0].AWRI()[1] ) );
  CHECK_THAT(    17.84450, WithinRel( chunk.elements()[0].AWRI()[2] ) );
  CHECK_THAT(    15.85751, WithinRel( chunk.elements()[0].atomicWeightRatios()[0] ) );
  CHECK_THAT(    16.85310, WithinRel( chunk.elements()[0].atomicWeightRatios()[1] ) );
  CHECK_THAT(    17.84450, WithinRel( chunk.elements()[0].atomicWeightRatios()[2] ) );
  CHECK_THAT(    3.744801, WithinRel( chunk.elements()[0].SFI()[0] ) );
  CHECK_THAT(    3.642671, WithinRel( chunk.elements()[0].SFI()[1] ) );
  CHECK_THAT(    3.846775, WithinRel( chunk.elements()[0].SFI()[2] ) );
  CHECK_THAT(    3.744801, WithinRel( chunk.elements()[0].freeScatteringCrossSections()[0] ) );
  CHECK_THAT(    3.642671, WithinRel( chunk.elements()[0].freeScatteringCrossSections()[1] ) );
  CHECK_THAT(    3.846775, WithinRel( chunk.elements()[0].freeScatteringCrossSections()[2] ) );

  CHECK( 5 == chunk.NC() );
}